

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_ManPatSatImprove(Gia_Man_t *p,int nWords0,int fVerbose)

{
  int iVar1;
  char *pcVar2;
  word *__ptr;
  Vec_Str_t *__ptr_00;
  Vec_Wrd_t *vSims;
  Gia_Man_t *pAig;
  Vec_Int_t *vCexStore;
  Vec_Wrd_t *pVVar3;
  long lVar4;
  int Counts [3];
  Vec_Str_t *vStatus;
  int local_48 [4];
  Vec_Str_t *local_38;
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_38 = (Vec_Str_t *)0x0;
  vSims = Gia_ManSimPatSim(p);
  pAig = Gia_ManSimPatGenMiter(p,vSims);
  vCexStore = Cbs2_ManSolveMiterNc(pAig,1000,&local_38,0);
  Gia_ManStop(pAig);
  iVar1 = local_38->nSize;
  if (0 < (long)iVar1) {
    pcVar2 = local_38->pArray;
    lVar4 = 0;
    do {
      if (2 < (byte)(pcVar2[lVar4] + 1U)) {
        __assert_fail("Status >= -1 && Status <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0x159,"void Gia_ManPatSatImprove(Gia_Man_t *, int, int)");
      }
      local_48[(int)pcVar2[lVar4] + 1] = local_48[(int)pcVar2[lVar4] + 1] + 1;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if (fVerbose != 0) {
    printf("Total = %d : SAT = %d.  UNSAT = %d.  UNDEC = %d.\n",
           (ulong)(uint)(local_48[2] + local_48[1] + local_48[0]));
  }
  if (local_48[1] == 0) {
    puts("There are no counter-examples.  No need for more simulation.");
  }
  else {
    pVVar3 = Gia_ManSimBitPacking(p,vCexStore,local_48[1],local_48[0]);
    if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
      __ptr = p->vSimsPi->pArray;
      if (__ptr != (word *)0x0) {
        free(__ptr);
        p->vSimsPi->pArray = (word *)0x0;
      }
      if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
        free(p->vSimsPi);
        p->vSimsPi = (Vec_Wrd_t *)0x0;
      }
    }
    p->vSimsPi = pVVar3;
  }
  __ptr_00 = local_38;
  if (local_38->pArray != (char *)0x0) {
    free(local_38->pArray);
    __ptr_00->pArray = (char *)0x0;
  }
  if (__ptr_00 != (Vec_Str_t *)0x0) {
    free(__ptr_00);
  }
  if (vCexStore->pArray != (int *)0x0) {
    free(vCexStore->pArray);
    vCexStore->pArray = (int *)0x0;
  }
  if (vCexStore != (Vec_Int_t *)0x0) {
    free(vCexStore);
  }
  if (vSims->pArray != (word *)0x0) {
    free(vSims->pArray);
    vSims->pArray = (word *)0x0;
  }
  if (vSims != (Vec_Wrd_t *)0x0) {
    free(vSims);
  }
  return;
}

Assistant:

void Gia_ManPatSatImprove( Gia_Man_t * p, int nWords0, int fVerbose )
{
    extern Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose );
    int i, Status, Counts[3] = {0};
    Gia_Man_t * pGia;
    Vec_Wrd_t * vSimsIn = NULL;
    Vec_Str_t * vStatus = NULL;
    Vec_Int_t * vCexStore = NULL;
    Vec_Wrd_t * vSims = Gia_ManSimPatSim( p );
    //Gia_ManSimProfile( p );
    pGia  = Gia_ManSimPatGenMiter( p, vSims );
    vCexStore = Cbs2_ManSolveMiterNc( pGia, 1000, &vStatus, 0 );
    Gia_ManStop( pGia );
    Vec_StrForEachEntry( vStatus, Status, i )
    {
        assert( Status >= -1 && Status <= 1 );
        Counts[Status+1]++;
    }
    if ( fVerbose )
        printf( "Total = %d : SAT = %d.  UNSAT = %d.  UNDEC = %d.\n", Counts[1]+Counts[2]+Counts[0], Counts[1], Counts[2], Counts[0] );
    if ( Counts[1] == 0 )
        printf( "There are no counter-examples.  No need for more simulation.\n" );
    else
    {
        vSimsIn = Gia_ManSimBitPacking( p, vCexStore, Counts[1], Counts[0] );
        Vec_WrdFreeP( &p->vSimsPi );
        p->vSimsPi = vSimsIn;
        //Gia_ManSimProfile( p );
    }
    Vec_StrFree( vStatus );
    Vec_IntFree( vCexStore );
    Vec_WrdFree( vSims );
}